

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

void __thiscall
duckdb::AddColumnInfo::AddColumnInfo
          (AddColumnInfo *this,AlterEntryData *data,ColumnDefinition *new_column,
          bool if_column_not_exists)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  undefined8 uVar6;
  storage_t sVar7;
  CompressionType CVar8;
  undefined7 uVar9;
  AlterEntryData local_98;
  
  paVar2 = &local_98.catalog.field_2;
  local_98.catalog._M_dataplus._M_p = (data->catalog)._M_dataplus._M_p;
  paVar1 = &(data->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p == paVar1) {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.catalog.field_2._8_8_ = *(undefined8 *)((long)&(data->catalog).field_2 + 8);
    local_98.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.catalog._M_string_length = (data->catalog)._M_string_length;
  paVar3 = &local_98.schema.field_2;
  (data->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (data->catalog)._M_string_length = 0;
  (data->catalog).field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (data->schema)._M_dataplus._M_p;
  paVar1 = &(data->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p == paVar1) {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.schema.field_2._8_8_ = *(undefined8 *)((long)&(data->schema).field_2 + 8);
    local_98.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.schema._M_string_length = (data->schema)._M_string_length;
  paVar4 = &local_98.name.field_2;
  (data->schema)._M_dataplus._M_p = (pointer)paVar1;
  (data->schema)._M_string_length = 0;
  (data->schema).field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (data->name)._M_dataplus._M_p;
  paVar1 = &(data->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p == paVar1) {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.name.field_2._8_8_ = *(undefined8 *)((long)&(data->name).field_2 + 8);
    local_98.name._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.name._M_string_length = (data->name)._M_string_length;
  (data->name)._M_dataplus._M_p = (pointer)paVar1;
  (data->name)._M_string_length = 0;
  (data->name).field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = data->if_not_found;
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,ADD_COLUMN,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddColumnInfo_024500e8;
  paVar2 = &(this->new_column).name.field_2;
  (this->new_column).name._M_dataplus._M_p = (pointer)paVar2;
  pcVar5 = (new_column->name)._M_dataplus._M_p;
  paVar1 = &(new_column->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(new_column->name).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->new_column).name.field_2 + 8) = uVar6;
  }
  else {
    (this->new_column).name._M_dataplus._M_p = pcVar5;
    (this->new_column).name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->new_column).name._M_string_length = (new_column->name)._M_string_length;
  (new_column->name)._M_dataplus._M_p = (pointer)paVar1;
  (new_column->name)._M_string_length = 0;
  (new_column->name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&(this->new_column).type,&new_column->type);
  CVar8 = new_column->compression_type;
  uVar9 = *(undefined7 *)&new_column->field_0x39;
  sVar7 = new_column->storage_oid;
  uVar6 = *(undefined8 *)((long)&new_column->oid + 1);
  *(undefined8 *)((long)&(this->new_column).storage_oid + 1) =
       *(undefined8 *)((long)&new_column->storage_oid + 1);
  *(undefined8 *)((long)&(this->new_column).oid + 1) = uVar6;
  (this->new_column).compression_type = CVar8;
  *(undefined7 *)&(this->new_column).field_0x39 = uVar9;
  (this->new_column).storage_oid = sVar7;
  (this->new_column).expression.
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (new_column->expression).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (new_column->expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  Value::Value(&(this->new_column).comment,&new_column->comment);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(this->new_column).tags,&new_column->tags,&new_column->tags);
  this->if_column_not_exists = if_column_not_exists;
  return;
}

Assistant:

AddColumnInfo::AddColumnInfo(AlterEntryData data, ColumnDefinition new_column, bool if_column_not_exists)
    : AlterTableInfo(AlterTableType::ADD_COLUMN, std::move(data)), new_column(std::move(new_column)),
      if_column_not_exists(if_column_not_exists) {
}